

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwSetWindowMonitor
               (GLFWwindow *wh,GLFWmonitor *mh,int xpos,int ypos,int width,int height,
               int refreshRate)

{
  undefined8 in_RAX;
  undefined4 in_register_00000014;
  
  if (wh == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gaotongsh[P]MeshEditorLite/deps/glfw/src/window.c"
                  ,0x399,
                  "void glfwSetWindowMonitor(GLFWwindow *, GLFWmonitor *, int, int, int, int, int)")
    ;
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gaotongsh[P]MeshEditorLite/deps/glfw/src/window.c"
                  ,0x39a,
                  "void glfwSetWindowMonitor(GLFWwindow *, GLFWmonitor *, int, int, int, int, int)")
    ;
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gaotongsh[P]MeshEditorLite/deps/glfw/src/window.c"
                  ,0x39b,
                  "void glfwSetWindowMonitor(GLFWwindow *, GLFWmonitor *, int, int, int, int, int)")
    ;
  }
  if (_glfw.initialized != 0) {
    if (width == 0 || height == 0) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",width,(ulong)(uint)height,in_RAX);
      return;
    }
    if (refreshRate < -1) {
      _glfwInputError(0x10004,"Invalid refresh rate %i",(ulong)(uint)refreshRate,in_RAX);
      return;
    }
    *(int *)(wh + 0x28) = width;
    *(int *)(wh + 0x2c) = height;
    *(int *)(wh + 0x3c) = refreshRate;
    _glfwPlatformSetWindowMonitor
              ((_GLFWwindow *)wh,(_GLFWmonitor *)mh,xpos,ypos,width,height,refreshRate);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0,CONCAT44(in_register_00000014,xpos),in_RAX);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowMonitor(GLFWwindow* wh,
                                  GLFWmonitor* mh,
                                  int xpos, int ypos,
                                  int width, int height,
                                  int refreshRate)
{
    _GLFWwindow* window = (_GLFWwindow*) wh;
    _GLFWmonitor* monitor = (_GLFWmonitor*) mh;
    assert(window != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT();

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);
        return;
    }

    if (refreshRate < 0 && refreshRate != GLFW_DONT_CARE)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid refresh rate %i",
                        refreshRate);
        return;
    }

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.refreshRate = refreshRate;

    _glfwPlatformSetWindowMonitor(window, monitor,
                                  xpos, ypos, width, height,
                                  refreshRate);
}